

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O2

void __thiscall
SmallVector_AppendIteratorRange_Test::~SmallVector_AppendIteratorRange_Test
          (SmallVector_AppendIteratorRange_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SmallVector, AppendIteratorRange) {
    pstore::small_vector<int, 4> a (std::size_t{4});
    std::iota (std::begin (a), std::end (a), 0);

    std::array<int, 4> extra;
    std::iota (std::begin (extra), std::end (extra), 100);

    a.append (std::begin (extra), std::end (extra));

    EXPECT_THAT (a, ::testing::ElementsAre (0, 1, 2, 3, 100, 101, 102, 103));
}